

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int ParseFilterHeader(VP8BitReader *br,VP8Decoder *dec)

{
  uint32_t uVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = VP8GetValue(br,1);
  (dec->filter_hdr).simple = uVar1;
  uVar1 = VP8GetValue(br,6);
  (dec->filter_hdr).level = uVar1;
  uVar1 = VP8GetValue(br,3);
  (dec->filter_hdr).sharpness = uVar1;
  uVar1 = VP8GetValue(br,1);
  (dec->filter_hdr).use_lf_delta = uVar1;
  if (uVar1 != 0) {
    uVar1 = VP8GetValue(br,1);
    if (uVar1 != 0) {
      lVar4 = 0;
      do {
        uVar1 = VP8GetValue(br,1);
        if (uVar1 != 0) {
          iVar2 = VP8GetSignedValue(br,6);
          (dec->filter_hdr).ref_lf_delta[lVar4] = iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        uVar1 = VP8GetValue(br,1);
        if (uVar1 != 0) {
          iVar2 = VP8GetSignedValue(br,6);
          (dec->filter_hdr).mode_lf_delta[lVar4] = iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
    }
  }
  if ((dec->filter_hdr).level == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = ((dec->filter_hdr).simple == 0) + 1;
  }
  dec->filter_type = iVar3;
  return (uint)(br->eof == 0);
}

Assistant:

static int ParseFilterHeader(VP8BitReader* br, VP8Decoder* const dec) {
  VP8FilterHeader* const hdr = &dec->filter_hdr;
  hdr->simple    = VP8Get(br, "global-header");
  hdr->level     = VP8GetValue(br, 6, "global-header");
  hdr->sharpness = VP8GetValue(br, 3, "global-header");
  hdr->use_lf_delta = VP8Get(br, "global-header");
  if (hdr->use_lf_delta) {
    if (VP8Get(br, "global-header")) {   // update lf-delta?
      int i;
      for (i = 0; i < NUM_REF_LF_DELTAS; ++i) {
        if (VP8Get(br, "global-header")) {
          hdr->ref_lf_delta[i] = VP8GetSignedValue(br, 6, "global-header");
        }
      }
      for (i = 0; i < NUM_MODE_LF_DELTAS; ++i) {
        if (VP8Get(br, "global-header")) {
          hdr->mode_lf_delta[i] = VP8GetSignedValue(br, 6, "global-header");
        }
      }
    }
  }
  dec->filter_type = (hdr->level == 0) ? 0 : hdr->simple ? 1 : 2;
  return !br->eof;
}